

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_delsuper(Pager *pPager,char *zSuper)

{
  int iVar1;
  bool bVar2;
  int flags_1;
  int c;
  int exists;
  int flags;
  int nSuperPtr;
  char *zFree;
  char *zSuperPtr;
  char *zJournal;
  i64 nSuperJournal;
  char *zSuperJournal;
  sqlite3_file *pJournal;
  sqlite3_file *pSuper;
  sqlite3_vfs *psStack_20;
  int rc;
  sqlite3_vfs *pVfs;
  char *zSuper_local;
  Pager *pPager_local;
  
  psStack_20 = pPager->pVfs;
  nSuperJournal = 0;
  _flags = (undefined1 *)0x0;
  pVfs = (sqlite3_vfs *)zSuper;
  zSuper_local = (char *)pPager;
  pJournal = (sqlite3_file *)sqlite3MallocZero((long)(psStack_20->szOsFile << 1));
  if (pJournal == (sqlite3_file *)0x0) {
    pSuper._4_4_ = 7;
    zSuperJournal = (char *)0x0;
  }
  else {
    c = 0x4001;
    pSuper._4_4_ = sqlite3OsOpen(psStack_20,(char *)pVfs,pJournal,0x4001,(int *)0x0);
    zSuperJournal = (char *)((long)&pJournal->pMethods + (long)psStack_20->szOsFile);
  }
  if ((pSuper._4_4_ == 0) &&
     (pSuper._4_4_ = sqlite3OsFileSize(pJournal,(i64 *)&zJournal), pSuper._4_4_ == 0)) {
    exists = psStack_20->mxPathname + 1;
    _flags = (undefined1 *)sqlite3Malloc((u64)(zJournal + (long)exists + 6));
    if (_flags == (undefined1 *)0x0) {
      pSuper._4_4_ = 7;
    }
    else {
      _flags[3] = 0;
      _flags[2] = 0;
      _flags[1] = 0;
      *_flags = 0;
      nSuperJournal = (i64)(_flags + 4);
      zFree = (char *)(nSuperJournal + (long)(zJournal + 2));
      pSuper._4_4_ = sqlite3OsRead(pJournal,(void *)nSuperJournal,(int)zJournal,0);
      if (pSuper._4_4_ == 0) {
        zJournal[nSuperJournal] = '\0';
        zJournal[nSuperJournal + 1] = '\0';
        pSuper._4_4_ = 0;
        for (zSuperPtr = (char *)nSuperJournal; (long)zSuperPtr - nSuperJournal < (long)zJournal;
            zSuperPtr = zSuperPtr + (iVar1 + 1)) {
          pSuper._4_4_ = sqlite3OsAccess(psStack_20,zSuperPtr,0,&flags_1);
          if (pSuper._4_4_ != 0) goto LAB_001dab20;
          iVar1 = 0;
          if (flags_1 != 0) {
            pSuper._4_4_ = sqlite3OsOpen(psStack_20,zSuperPtr,(sqlite3_file *)zSuperJournal,0x4001,
                                         (int *)0x0);
            if (pSuper._4_4_ != 0) goto LAB_001dab20;
            pSuper._4_4_ = readSuperJournal((sqlite3_file *)zSuperJournal,zFree,exists);
            sqlite3OsClose((sqlite3_file *)zSuperJournal);
            if (pSuper._4_4_ != 0) goto LAB_001dab20;
            bVar2 = false;
            if (*zFree != '\0') {
              iVar1 = strcmp(zFree,(char *)pVfs);
              bVar2 = iVar1 == 0;
            }
            iVar1 = pSuper._4_4_;
            if (bVar2) goto LAB_001dab20;
          }
          pSuper._4_4_ = iVar1;
          iVar1 = sqlite3Strlen30(zSuperPtr);
        }
        sqlite3OsClose(pJournal);
        pSuper._4_4_ = sqlite3OsDelete(psStack_20,(char *)pVfs,0);
      }
    }
  }
LAB_001dab20:
  sqlite3_free(_flags);
  if (pJournal != (sqlite3_file *)0x0) {
    sqlite3OsClose(pJournal);
    sqlite3_free(pJournal);
  }
  return pSuper._4_4_;
}

Assistant:

static int pager_delsuper(Pager *pPager, const char *zSuper){
  sqlite3_vfs *pVfs = pPager->pVfs;
  int rc;                   /* Return code */
  sqlite3_file *pSuper;     /* Malloc'd super-journal file descriptor */
  sqlite3_file *pJournal;   /* Malloc'd child-journal file descriptor */
  char *zSuperJournal = 0;  /* Contents of super-journal file */
  i64 nSuperJournal;        /* Size of super-journal file */
  char *zJournal;           /* Pointer to one journal within MJ file */
  char *zSuperPtr;          /* Space to hold super-journal filename */
  char *zFree = 0;          /* Free this buffer */
  int nSuperPtr;            /* Amount of space allocated to zSuperPtr[] */

  /* Allocate space for both the pJournal and pSuper file descriptors.
  ** If successful, open the super-journal file for reading.
  */
  pSuper = (sqlite3_file *)sqlite3MallocZero(pVfs->szOsFile * 2);
  if( !pSuper ){
    rc = SQLITE_NOMEM_BKPT;
    pJournal = 0;
  }else{
    const int flags = (SQLITE_OPEN_READONLY|SQLITE_OPEN_SUPER_JOURNAL);
    rc = sqlite3OsOpen(pVfs, zSuper, pSuper, flags, 0);
    pJournal = (sqlite3_file *)(((u8 *)pSuper) + pVfs->szOsFile);
  }
  if( rc!=SQLITE_OK ) goto delsuper_out;

  /* Load the entire super-journal file into space obtained from
  ** sqlite3_malloc() and pointed to by zSuperJournal.   Also obtain
  ** sufficient space (in zSuperPtr) to hold the names of super-journal
  ** files extracted from regular rollback-journals.
  */
  rc = sqlite3OsFileSize(pSuper, &nSuperJournal);
  if( rc!=SQLITE_OK ) goto delsuper_out;
  nSuperPtr = pVfs->mxPathname+1;
  zFree = sqlite3Malloc(4 + nSuperJournal + nSuperPtr + 2);
  if( !zFree ){
    rc = SQLITE_NOMEM_BKPT;
    goto delsuper_out;
  }
  zFree[0] = zFree[1] = zFree[2] = zFree[3] = 0;
  zSuperJournal = &zFree[4];
  zSuperPtr = &zSuperJournal[nSuperJournal+2];
  rc = sqlite3OsRead(pSuper, zSuperJournal, (int)nSuperJournal, 0);
  if( rc!=SQLITE_OK ) goto delsuper_out;
  zSuperJournal[nSuperJournal] = 0;
  zSuperJournal[nSuperJournal+1] = 0;

  zJournal = zSuperJournal;
  while( (zJournal-zSuperJournal)<nSuperJournal ){
    int exists;
    rc = sqlite3OsAccess(pVfs, zJournal, SQLITE_ACCESS_EXISTS, &exists);
    if( rc!=SQLITE_OK ){
      goto delsuper_out;
    }
    if( exists ){
      /* One of the journals pointed to by the super-journal exists.
      ** Open it and check if it points at the super-journal. If
      ** so, return without deleting the super-journal file.
      ** NB:  zJournal is really a MAIN_JOURNAL.  But call it a
      ** SUPER_JOURNAL here so that the VFS will not send the zJournal
      ** name into sqlite3_database_file_object().
      */
      int c;
      int flags = (SQLITE_OPEN_READONLY|SQLITE_OPEN_SUPER_JOURNAL);
      rc = sqlite3OsOpen(pVfs, zJournal, pJournal, flags, 0);
      if( rc!=SQLITE_OK ){
        goto delsuper_out;
      }

      rc = readSuperJournal(pJournal, zSuperPtr, nSuperPtr);
      sqlite3OsClose(pJournal);
      if( rc!=SQLITE_OK ){
        goto delsuper_out;
      }

      c = zSuperPtr[0]!=0 && strcmp(zSuperPtr, zSuper)==0;
      if( c ){
        /* We have a match. Do not delete the super-journal file. */
        goto delsuper_out;
      }
    }
    zJournal += (sqlite3Strlen30(zJournal)+1);
  }

  sqlite3OsClose(pSuper);
  rc = sqlite3OsDelete(pVfs, zSuper, 0);

delsuper_out:
  sqlite3_free(zFree);
  if( pSuper ){
    sqlite3OsClose(pSuper);
    assert( !isOpen(pJournal) );
    sqlite3_free(pSuper);
  }
  return rc;
}